

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void LinkedList_PrependEntry
               (LinkedList **start,void *toAdd,FAudioMutex lock,FAudioMallocFunc pMalloc)

{
  undefined8 *puVar1;
  code *in_RCX;
  undefined8 in_RSI;
  long *in_RDI;
  LinkedList *newEntry;
  
  puVar1 = (undefined8 *)(*in_RCX)(0x10);
  *puVar1 = in_RSI;
  FAudio_PlatformLockMutex((FAudioMutex)0x12e25b);
  puVar1[1] = *in_RDI;
  *in_RDI = (long)puVar1;
  FAudio_PlatformUnlockMutex((FAudioMutex)0x12e281);
  return;
}

Assistant:

void LinkedList_PrependEntry(
	LinkedList **start,
	void* toAdd,
	FAudioMutex lock,
	FAudioMallocFunc pMalloc
) {
	LinkedList *newEntry;
	newEntry = (LinkedList*) pMalloc(sizeof(LinkedList));
	newEntry->entry = toAdd;
	FAudio_PlatformLockMutex(lock);
	newEntry->next = *start;
	*start = newEntry;
	FAudio_PlatformUnlockMutex(lock);
}